

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::InternalCopyArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *newValue;
  ulong uVar5;
  uint uVar6;
  uint32 count;
  undefined1 local_48 [8];
  ArrayElementEnumerator e;
  
  if ((end <= start) || ((srcArray->super_ArrayObject).length < end)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2c8a,"(start < end && end <= srcArray->length)",
                                "start < end && end <= srcArray->length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_48,srcArray,start,end);
  if (local_48 == (undefined1  [8])0x0) {
    count = 0;
  }
  else {
    count = 0;
LAB_00b83a15:
    uVar5 = (ulong)(uint)e.seg;
    while( true ) {
      uVar6 = (int)uVar5 + 1;
      if (uVar6 < e.seg._4_4_) {
        uVar6 = e.seg._4_4_;
      }
      while (uVar6 - 1 != (int)uVar5) {
        e.seg._0_4_ = (int)uVar5 + 1;
        uVar5 = (ulong)(uint)e.seg;
        if (*(undefined1 **)(&((SparseArraySegmentBase *)((long)local_48 + 0x18))->left + uVar5 * 2)
            != &DAT_40002fff80002) {
          uVar3 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_48);
          newValue = ArrayElementEnumerator::GetItem<void*>((ArrayElementEnumerator *)local_48);
          DirectSetItemAt<void*>(dstArray,uVar3 + (dstIndex - start),newValue);
          count = count + 1;
          if (local_48 == (undefined1  [8])0x0) goto LAB_00b83aab;
          goto LAB_00b83a15;
        }
      }
      local_48 = (undefined1  [8])((Type *)((long)local_48 + 0x10))->ptr;
      e.seg._0_4_ = uVar6;
      if (local_48 == (undefined1  [8])0x0) goto LAB_00b83aab;
      uVar6 = e.endIndex - ((SparseArraySegmentBase *)local_48)->left;
      if (e.endIndex < ((SparseArraySegmentBase *)local_48)->left || uVar6 == 0) break;
      e.seg._4_4_ = ((SparseArraySegmentBase *)local_48)->length;
      if (uVar6 < ((SparseArraySegmentBase *)local_48)->length) {
        e.seg._4_4_ = uVar6;
      }
      uVar5 = 0xffffffff;
    }
    local_48 = (undefined1  [8])0x0;
  }
LAB_00b83aab:
  if (count + start != end) {
    InternalFillFromPrototype(dstArray,dstIndex,srcArray,start,end,count);
  }
  return;
}

Assistant:

void JavascriptArray::InternalCopyArrayElements(JavascriptArray* dstArray, const uint32 dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<Var>())
        {
            uint32 n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<Var>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            InternalFillFromPrototype(dstArray, dstIndex, srcArray, start, end, count);
        }
    }